

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Moira.cpp
# Opt level: O3

void __thiscall moira::Moira::Moira(Moira *this)

{
  ExecPtr *pEVar1;
  InstrInfo *pIVar2;
  DasmPtr *pDVar3;
  
  this->_vptr_Moira = (_func_int **)&PTR__Moira_0053d220;
  this->cpuModel = M68000;
  this->dasmModel = M68000;
  Debugger::Debugger(&this->debugger,this);
  *(undefined8 *)((long)&(this->reg).pc + 2) = 0;
  (this->reg).sr.s = false;
  (this->reg).sr.m = false;
  (this->reg).sr.x = false;
  (this->reg).sr.n = false;
  (this->reg).sr.z = false;
  (this->reg).sr.v = false;
  (this->reg).sr.c = false;
  (this->reg).sr.ipl = '\0';
  this->clock = 0;
  (this->reg).pc = 0;
  (this->reg).pc0 = 0;
  *(undefined8 *)&(this->reg).field_3 = 0;
  *(undefined8 *)((long)&(this->reg).field_3 + 8) = 0;
  *(undefined8 *)((long)&(this->reg).field_3 + 0x10) = 0;
  *(undefined8 *)((long)&(this->reg).field_3 + 0x18) = 0;
  *(undefined8 *)((long)&(this->reg).field_3 + 0x20) = 0;
  *(undefined8 *)((long)&(this->reg).field_3 + 0x28) = 0;
  *(undefined8 *)((long)&(this->reg).field_3 + 0x30) = 0;
  *(undefined8 *)((long)&(this->reg).field_3 + 0x38) = 0;
  *(undefined8 *)((long)&(this->reg).field_3 + 0x3d) = 0;
  *(undefined8 *)((long)&(this->reg).isp + 1) = 0;
  (this->reg).vbr = 0;
  (this->reg).sfc = 0;
  (this->reg).dfc = 0;
  (this->reg).cacr = 0;
  *(undefined8 *)((long)&(this->reg).cacr + 1) = 0;
  *(undefined8 *)((long)&(this->queue).irc + 1) = 0;
  this->fcl = '\x02';
  this->fcSource = '\0';
  this->exception = 0;
  this->cp = 0;
  this->loopModeDelay = 2;
  this->readBuffer = 0;
  this->writeBuffer = 0;
  this->flags = 0;
  this->exec = (ExecPtr *)0x0;
  this->loop = (ExecPtr *)0x0;
  this->dasm = (DasmPtr *)0x0;
  this->info = (InstrInfo *)0x0;
  pEVar1 = (ExecPtr *)operator_new__(0x100000);
  this->exec = pEVar1;
  pEVar1 = (ExecPtr *)operator_new__(0x100000);
  this->loop = pEVar1;
  pIVar2 = (InstrInfo *)operator_new__(0xc0000);
  this->info = pIVar2;
  pDVar3 = (DasmPtr *)operator_new__(0x100000);
  this->dasm = pDVar3;
  createJumpTable(this,this->cpuModel,this->dasmModel);
  (this->instrStyle).syntax = MOIRA;
  (this->instrStyle).letterCase = MIXED_CASE;
  (this->instrStyle).numberFormat.prefix = "$";
  (this->instrStyle).numberFormat.radix = '\x10';
  (this->instrStyle).numberFormat.upperCase = false;
  (this->instrStyle).numberFormat.plainZero = false;
  (this->instrStyle).tab = 8;
  (this->dataStyle).syntax = MOIRA;
  (this->dataStyle).letterCase = MIXED_CASE;
  (this->dataStyle).numberFormat.prefix = "";
  (this->dataStyle).numberFormat.radix = '\x10';
  (this->dataStyle).numberFormat.upperCase = false;
  (this->dataStyle).numberFormat.plainZero = false;
  (this->dataStyle).tab = 1;
  return;
}

Assistant:

Moira::Moira()
{
    exec = new ExecPtr[65536];
    loop = new ExecPtr[65536];
    if (MOIRA_BUILD_INSTR_INFO_TABLE) info = new InstrInfo[65536];
    if (MOIRA_ENABLE_DASM) dasm = new DasmPtr[65536];

    createJumpTable(cpuModel, dasmModel);

    instrStyle = DasmStyle {

        .syntax         = Syntax::MOIRA,
        .letterCase     = LetterCase::MIXED_CASE,
        .numberFormat   = { .prefix = "$", .radix = 16, .upperCase = false, .plainZero = false },
        .tab            = 8
    };

    dataStyle = DasmStyle {

        .syntax         = Syntax::MOIRA,
        .letterCase     = LetterCase::MIXED_CASE,
        .numberFormat   = { .prefix = "", .radix = 16, .upperCase = false, .plainZero = false },
        .tab            = 1
    };
}